

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDIS.cpp
# Opt level: O0

int main(void)

{
  KUINT16 KVar1;
  ostream *poVar2;
  exception *e;
  PduPtr local_318;
  int local_2fc;
  int i_1;
  Entity_State_PDU local_2d0;
  KDataStream local_180;
  int local_154;
  undefined1 local_150 [4];
  int i;
  Bundle pduBundle;
  allocator<char> local_f9;
  KString local_f8;
  undefined1 local_d8 [8];
  Connection myConnection;
  
  myConnection.m_sLastIP.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"192.168.3.255",&local_f9);
  KDIS::NETWORK::Connection::Connection
            ((Connection *)local_d8,&local_f8,3000,false,true,(PDU_Factory *)0x0,false);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  KDIS::PDU::Bundle::Bundle((Bundle *)local_150);
  for (local_154 = 0; local_154 < 10; local_154 = local_154 + 1) {
    EntityGenerator::GenerateEntity();
    KDIS::PDU::Entity_State_PDU::Encode(&local_180,&local_2d0);
    KDIS::PDU::Bundle::AddPDU((Bundle *)local_150,&local_180);
    KDIS::KDataStream::~KDataStream(&local_180);
    KDIS::PDU::Entity_State_PDU::~Entity_State_PDU(&local_2d0);
  }
  KDIS::PDU::Bundle::Encode((KDataStream *)&stack0xfffffffffffffd08,(Bundle *)local_150);
  KDIS::NETWORK::Connection::Send((Connection *)local_d8,(KDataStream *)&stack0xfffffffffffffd08);
  KDIS::KDataStream::~KDataStream((KDataStream *)&stack0xfffffffffffffd08);
  poVar2 = std::operator<<((ostream *)&std::cout,"1: Sent Bundle, Size: ");
  KVar1 = KDIS::PDU::Bundle::GetLength((Bundle *)local_150);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,KVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  KDIS::PDU::Bundle::ClearPDUs((Bundle *)local_150);
  for (local_2fc = 0; local_2fc < 10; local_2fc = local_2fc + 1) {
    EntityGenerator::GenerateEntityRef();
    KDIS::PDU::Bundle::AddPDU((Bundle *)local_150,&local_318);
    KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>::~KRef_Ptr(&local_318);
  }
  KDIS::PDU::Bundle::Encode((KDataStream *)&e,(Bundle *)local_150);
  KDIS::NETWORK::Connection::Send((Connection *)local_d8,(KDataStream *)&e);
  KDIS::KDataStream::~KDataStream((KDataStream *)&e);
  poVar2 = std::operator<<((ostream *)&std::cout,"2: Sent Bundle, Size: ");
  KVar1 = KDIS::PDU::Bundle::GetLength((Bundle *)local_150);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,KVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  KDIS::PDU::Bundle::~Bundle((Bundle *)local_150);
  KDIS::NETWORK::Connection::~Connection((Connection *)local_d8);
  return 0;
}

Assistant:

int main()
{
    try
    {
        // Note: This address will probably be different for your network.
        Connection myConnection( "192.168.3.255" );

        // We have 2 ways we can use the Bundle.

        //
        // 1
        // We can give it PDU data streams and it will concatenate them for us into a single packet.

        // Create the bundle. Just a collection of random ESPDUs.
        Bundle pduBundle;
        for( int i = 0; i < PDU_COUNT; ++i )
        {
            pduBundle.AddPDU( EntityGenerator::GenerateEntity().Encode() );
        }

        // Now send the bundle
        myConnection.Send( pduBundle.Encode() );
        cout << "1: Sent Bundle, Size: " << pduBundle.GetLength() << endl;

        //
        // 2
        // We can give it PDU pointers/references which will be encoded each time.
        // We can then use this over time if we want to keep sending the PDU together.
        pduBundle.ClearPDUs();

        for( int i = 0; i < PDU_COUNT; ++i )
        {
            pduBundle.AddPDU( EntityGenerator::GenerateEntityRef() );
        }

        // Now send the bundle
        myConnection.Send( pduBundle.Encode() );

        cout << "2: Sent Bundle, Size: " << pduBundle.GetLength() << endl;
    }
    catch( exception & e )
    {
        cout << e.what() << endl;
    }

    return 0;
}